

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlogging.cpp
# Opt level: O3

void __thiscall QMessageLogger::debug(QMessageLogger *this,CategoryFunction catFunc,char *msg,...)

{
  char in_AL;
  QLoggingCategory *categoryOverride;
  undefined8 in_RCX;
  undefined8 in_R8;
  undefined8 in_R9;
  long in_FS_OFFSET;
  undefined4 in_XMM0_Da;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  QInternalMessageLogContext ctxt;
  undefined1 auStack_238 [24];
  undefined8 local_220;
  undefined8 local_218;
  undefined8 local_210;
  undefined4 local_208;
  undefined8 local_1f8;
  undefined8 local_1e8;
  undefined8 local_1d8;
  undefined8 local_1c8;
  undefined8 local_1b8;
  undefined8 local_1a8;
  undefined8 local_198;
  __va_list_tag local_188;
  QInternalMessageLogContext local_168;
  long local_28;
  
  if (in_AL != '\0') {
    local_208 = in_XMM0_Da;
    local_1f8 = in_XMM1_Qa;
    local_1e8 = in_XMM2_Qa;
    local_1d8 = in_XMM3_Qa;
    local_1c8 = in_XMM4_Qa;
    local_1b8 = in_XMM5_Qa;
    local_1a8 = in_XMM6_Qa;
    local_198 = in_XMM7_Qa;
  }
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  local_220 = in_RCX;
  local_218 = in_R8;
  local_210 = in_R9;
  categoryOverride = (*catFunc)();
  if (((categoryOverride->field_2).bools.enabledDebug._q_value._M_base._M_i & 1U) != 0) {
    memset(&local_168,0xaa,0x140);
    QInternalMessageLogContext::QInternalMessageLogContext
              (&local_168,&this->context,categoryOverride);
    local_188.gp_offset = 0x18;
    local_188.fp_offset = 0x30;
    local_188.overflow_arg_area = &stack0x00000008;
    local_188.reg_save_area = auStack_238;
    qt_message(QtDebugMsg,&local_168.super_QMessageLogContext,msg,&local_188);
    if (local_168.backtrace.super__Optional_base<QVarLengthArray<void_*,_32LL>,_false,_false>.
        _M_payload.super__Optional_payload<QVarLengthArray<void_*,_32LL>,_true,_false,_false>.
        super__Optional_payload_base<QVarLengthArray<void_*,_32LL>_>._M_engaged == true) {
      local_168.backtrace.super__Optional_base<QVarLengthArray<void_*,_32LL>,_false,_false>.
      _M_payload.super__Optional_payload<QVarLengthArray<void_*,_32LL>,_true,_false,_false>.
      super__Optional_payload_base<QVarLengthArray<void_*,_32LL>_>._M_engaged = false;
      if ((undefined1 *)
          local_168.backtrace.super__Optional_base<QVarLengthArray<void_*,_32LL>,_false,_false>.
          _M_payload.super__Optional_payload<QVarLengthArray<void_*,_32LL>,_true,_false,_false>.
          super__Optional_payload_base<QVarLengthArray<void_*,_32LL>_>._M_payload._M_value.
          super_QVLABase<void_*>.super_QVLABaseBase.ptr !=
          (undefined1 *)
          ((long)&local_168.backtrace.
                  super__Optional_base<QVarLengthArray<void_*,_32LL>,_false,_false>._M_payload.
                  super__Optional_payload<QVarLengthArray<void_*,_32LL>,_true,_false,_false>.
                  super__Optional_payload_base<QVarLengthArray<void_*,_32LL>_>._M_payload + 0x18)) {
        QtPrivate::sizedFree
                  (local_168.backtrace.
                   super__Optional_base<QVarLengthArray<void_*,_32LL>,_false,_false>._M_payload.
                   super__Optional_payload<QVarLengthArray<void_*,_32LL>,_true,_false,_false>.
                   super__Optional_payload_base<QVarLengthArray<void_*,_32LL>_>._M_payload._M_value.
                   super_QVLABase<void_*>.super_QVLABaseBase.ptr,
                   local_168.backtrace.
                   super__Optional_base<QVarLengthArray<void_*,_32LL>,_false,_false>._M_payload.
                   super__Optional_payload<QVarLengthArray<void_*,_32LL>,_true,_false,_false>.
                   super__Optional_payload_base<QVarLengthArray<void_*,_32LL>_>._M_payload._M_value.
                   super_QVLABase<void_*>.super_QVLABaseBase.a << 3);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QMessageLogger::debug(QMessageLogger::CategoryFunction catFunc,
                           const char *msg, ...) const
{
    const QLoggingCategory &cat = (*catFunc)();
    if (!cat.isDebugEnabled())
        return;

    QInternalMessageLogContext ctxt(context, cat());

    va_list ap;
    va_start(ap, msg); // use variable arg list
    qt_message(QtDebugMsg, ctxt, msg, ap);
    va_end(ap);
}